

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

TryEmplaceResult * __thiscall
QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
::tryEmplace_impl<QAbstractItemView*const&>
          (TryEmplaceResult *__return_storage_ptr__,
          QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
          *this,QAbstractItemView **key)

{
  uchar uVar1;
  uint *puVar2;
  Span *pSVar3;
  Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
  *pDVar4;
  Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  *pNVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar9;
  Bucket BVar10;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar8;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)this == 0) {
    pDVar4 = QHashPrivate::
             Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
             ::detached((Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
                         *)0x0);
    *(Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
      **)this = pDVar4;
  }
  local_40.d = (Data *)0x0;
  uVar7 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
  uVar7 = uVar7 >> 0x20 ^
          *(ulong *)(*(Data<QHashPrivate::Node<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>>
                       **)this + 0x18) ^ uVar7;
  BVar10 = QHashPrivate::
           Data<QHashPrivate::Node<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>>
           ::findBucketWithHash<QAbstractItemView*>
                     (*(Data<QHashPrivate::Node<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>>
                        **)this,key,uVar7);
  uVar8 = BVar10.index;
  pSVar5 = BVar10.span;
  uVar1 = pSVar5->offsets[uVar8];
  puVar2 = *(uint **)this;
  if ((puVar2 == (uint *)0x0) || (1 < *puVar2)) {
LAB_0057006b:
    QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::operator=(&local_40,
                (QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
                 *)this);
    if (uVar1 == 0xff) {
      bVar9 = *(ulong *)(*(long *)this + 0x10) >> 1 <= *(ulong *)(*(long *)this + 8);
    }
    else {
      bVar9 = false;
    }
    pDVar4 = *(Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
               **)this;
    pSVar3 = pDVar4->spans;
    if (bVar9) {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
               ::detached(pDVar4,pDVar4->size + 1);
    }
    else {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
               ::detached(pDVar4);
    }
    *(Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
      **)this = pDVar4;
    if (bVar9) {
      BVar10 = QHashPrivate::
               Data<QHashPrivate::Node<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>>
               ::findBucketWithHash<QAbstractItemView*>
                         ((Data<QHashPrivate::Node<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>>
                           *)pDVar4,key,uVar7);
    }
    else {
      BVar10.index._0_4_ = (uint)BVar10.index & 0x7f;
      BVar10.span = pDVar4->spans +
                    ((((ulong)((long)pSVar5 - (long)pSVar3) >> 4) * 0x1c71c71c71c71c80 | uVar8) >> 7
                    );
      BVar10.index._4_4_ = 0;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_00570147;
    if (*(ulong *)(puVar2 + 4) >> 1 <= *(ulong *)(puVar2 + 2)) goto LAB_0057006b;
  }
  if (uVar1 == 0xff) {
    pNVar6 = QHashPrivate::
             Span<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
             ::insert(BVar10.span,BVar10.index);
    pNVar6->key = *key;
    (pNVar6->value).
    super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar6->value).
    super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar6->value).
    super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(long *)(*(long *)this + 8) = *(long *)(*(long *)this + 8) + 1;
  }
LAB_00570147:
  pSVar5 = (*(Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
              **)this)->spans;
  (__return_storage_ptr__->iterator).i.d =
       *(Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
         **)this;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar10.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar10.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }